

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_api_v2.c
# Opt level: O0

MPP_RET hal_h264e_init(void *hal,MppEncHalCfg *cfg)

{
  RK_U32 RVar1;
  RK_U32 hw_id;
  RK_U32 vcodec_type;
  MPP_RET ret;
  void *hw_ctx;
  MppEncHalApi *api;
  HalH264eCtx *ctx;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  hw_ctx = (void *)0x0;
  _vcodec_type = (void *)0x0;
  hw_id = 0;
  RVar1 = mpp_get_vcodec_type();
  mpp_env_get_u32("hal_h264e_debug",&hal_h264e_debug,0);
  if ((RVar1 & 0x10000) == 0) {
    if ((RVar1 & 0x40000) == 0) {
      if ((RVar1 & 0x20000) == 0) {
        _mpp_log_l(2,"hal_h264e_api_v2","vcodec type %08x can not find H.264 encoder device\n",
                   (char *)0x0,(ulong)RVar1);
        hw_id = 0xffffffff;
      }
      else {
        hw_ctx = &hal_h264e_vepu1;
      }
    }
    else {
      hw_ctx = &hal_h264e_vepu2;
    }
  }
  else {
    RVar1 = mpp_get_client_hw_id(0x10);
    if (RVar1 == 0x50602715) {
      hw_ctx = &hal_h264e_vepu511;
    }
    else if (RVar1 == 0x50603312) {
      hw_ctx = &hal_h264e_vepu580;
    }
    else if (RVar1 == 0x50603313) {
      hw_ctx = &hal_h264e_vepu540c;
    }
    else if (RVar1 == 0x506f2314) {
      hw_ctx = &hal_h264e_vepu510;
    }
    else {
      hw_ctx = &hal_h264e_vepu541;
    }
  }
  if ((hw_ctx == (void *)0x0) &&
     (_mpp_log_l(2,"hal_h264e_api_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"api",
                 "hal_h264e_init",0x56), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (hw_id == 0) {
    _vcodec_type = mpp_osal_calloc("hal_h264e_init",(ulong)*(uint *)((long)hw_ctx + 0xc));
  }
  *(void **)hal = hw_ctx;
  *(void **)((long)hal + 8) = _vcodec_type;
  if (hw_id == 0) {
    hal_local._4_4_ = (**(code **)((long)hw_ctx + 0x18))(_vcodec_type,cfg);
  }
  else {
    hal_local._4_4_ = hw_id;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h264e_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eCtx *ctx = (HalH264eCtx *)hal;
    const MppEncHalApi *api = NULL;
    void *hw_ctx = NULL;
    MPP_RET ret = MPP_OK;
    RK_U32 vcodec_type = mpp_get_vcodec_type();

    mpp_env_get_u32("hal_h264e_debug", &hal_h264e_debug, 0);

    if (vcodec_type & HAVE_RKVENC) {
        RK_U32 hw_id = mpp_get_client_hw_id(VPU_CLIENT_RKVENC);

        switch (hw_id) {
        case HWID_VEPU58X : {
            api = &hal_h264e_vepu580;
        } break;
        case HWID_VEPU540C : {
            api = &hal_h264e_vepu540c;
        } break;
        case HWID_VEPU510 : {
            api = &hal_h264e_vepu510;
        } break;
        case HWID_VEPU511 : {
            api = &hal_h264e_vepu511;
        } break;
        default : {
            api = &hal_h264e_vepu541;
        } break;
        }
    } else if (vcodec_type & HAVE_VEPU2) {
        api = &hal_h264e_vepu2;
    } else if (vcodec_type & HAVE_VEPU1) {
        api = &hal_h264e_vepu1;
    } else {
        mpp_err("vcodec type %08x can not find H.264 encoder device\n",
                vcodec_type);
        ret = MPP_NOK;
    }

    mpp_assert(api);

    if (!ret)
        hw_ctx = mpp_calloc_size(void, api->ctx_size);

    ctx->api = api;
    ctx->hw_ctx = hw_ctx;

    if (ret)
        return ret;

    ret = api->init(hw_ctx, cfg);
    return ret;
}